

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O2

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,int _defaultValue)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
  local_58;
  
  std::__cxx11::string::string((string *)&local_58,(string *)_name);
  local_58.second = INT;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Type>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type>,std::_Select1st<std::pair<std::__cxx11::string_const,Type>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
              *)&this->type_dict,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,(string *)_name);
  local_58.second = _defaultValue;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)&this->int_dict,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, int _defaultValue)
{
    type_dict.insert(std::make_pair(_name, INT));
    int_dict.insert(std::make_pair(_name, _defaultValue));
}